

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O1

void __thiscall
xray_re::cse_alife_object_hanging_lamp::state_read
          (cse_alife_object_hanging_lamp *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  uint value;
  uint value_1;
  undefined1 auStack_28 [4];
  undefined1 local_24 [4];
  
  if (0x14 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
             super_cse_alife_object.super_cse_abstract.m_version) {
    cse_alife_dynamic_object_visual::state_read
              (&this->super_cse_alife_dynamic_object_visual,packet,0);
  }
  if (0x44 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
             super_cse_alife_object.super_cse_abstract.m_version) {
    cse_ph_skeleton::state_read(&this->super_cse_ph_skeleton,packet,0);
  }
  uVar1 = (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
          super_cse_alife_object.super_cse_abstract.m_version;
  if (uVar1 < 0x20) {
    cse_visual::visual_read
              (&(this->super_cse_alife_dynamic_object_visual).super_cse_visual,packet,uVar1);
  }
  uVar1 = (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
          super_cse_alife_object.super_cse_abstract.m_version;
  xr_packet::r_raw(packet,&this->m_color,4);
  if (uVar1 < 0x31) {
    xr_packet::r_sz(packet,&this->m_color_animator);
    xr_packet::skip_sz(packet);
    xr_packet::skip_sz(packet);
    xr_packet::r_raw(packet,&this->m_range,4);
    xr_packet::r_angle8(packet);
    if (10 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
             super_cse_alife_object.super_cse_abstract.m_version) {
      xr_packet::r_raw(packet,&this->m_brightness,4);
    }
    if (0xb < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
              super_cse_alife_object.super_cse_abstract.m_version) {
      xr_packet::r_raw(packet,&(this->super_cse_ph_skeleton).field_0x2c,2);
    }
    if (0xc < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
              super_cse_alife_object.super_cse_abstract.m_version) {
      xr_packet::r_raw(packet,auStack_28,4);
    }
    if (0x11 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
               super_cse_alife_object.super_cse_abstract.m_version) {
      xr_packet::r_sz(packet,&(this->super_cse_alife_dynamic_object_visual).super_cse_visual.
                              m_startup_animation);
    }
    if (0x2a < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
               super_cse_alife_object.super_cse_abstract.m_version) {
      xr_packet::skip_sz(packet);
      xr_packet::r_raw(packet,local_24,4);
    }
    if (0x2b < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
               super_cse_alife_object.super_cse_abstract.m_version) {
      xr_packet::r_sz(packet,&this->m_fixed_bones);
    }
    if ((this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
        super_cse_alife_object.super_cse_abstract.m_version < 0x2d) goto LAB_00151bdb;
  }
  else {
    xr_packet::r_raw(packet,&this->m_brightness,4);
    xr_packet::r_sz(packet,&this->m_color_animator);
    xr_packet::r_raw(packet,&this->m_range,4);
    xr_packet::r_raw(packet,&(this->super_cse_ph_skeleton).field_0x2c,2);
    xr_packet::r_sz(packet,&(this->super_cse_alife_dynamic_object_visual).super_cse_visual.
                            m_startup_animation);
    xr_packet::r_sz(packet,&this->m_fixed_bones);
  }
  xr_packet::r_raw(packet,&this->m_health,4);
LAB_00151bdb:
  if (0x37 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
             super_cse_alife_object.super_cse_abstract.m_version) {
    xr_packet::r_raw(packet,&this->m_virtual_size,4);
    xr_packet::r_raw(packet,&this->m_ambient_radius,4);
    xr_packet::r_raw(packet,&this->m_ambient_power,4);
    xr_packet::r_sz(packet,&this->m_ambient_texture);
    xr_packet::r_sz(packet,&this->m_light_texture);
    xr_packet::r_sz(packet,&this->m_light_main_bone);
    xr_packet::r_raw(packet,&this->m_spot_cone_angle,4);
    xr_packet::r_sz(packet,&this->m_glow_texture);
    xr_packet::r_raw(packet,&this->m_glow_radius,4);
  }
  if (0x60 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
             super_cse_alife_object.super_cse_abstract.m_version) {
    xr_packet::r_sz(packet,&this->m_light_ambient_bone);
  }
  if (0x76 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
             super_cse_alife_object.super_cse_abstract.m_version) {
    xr_packet::r_raw(packet,&this->m_cs_unk1_float,4);
    xr_packet::r_raw(packet,&this->m_cs_unk2_float,4);
    xr_packet::r_raw(packet,&this->m_cs_unk3_float,4);
  }
  return;
}

Assistant:

void cse_alife_object_hanging_lamp::state_read(xr_packet& packet, uint16_t size)
{
	if (m_version > CSE_VERSION_0x14)
		cse_alife_dynamic_object_visual::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x45)
		cse_ph_skeleton::state_read(packet, size);
	if (m_version < CSE_VERSION_0x20)
		cse_visual::visual_read(packet, m_version);
	if (m_version < CSE_VERSION_0x31) {
		packet.r_u32(m_color);
		packet.r_sz(m_color_animator);
		packet.skip_sz();
		packet.skip_sz();
		packet.r_float(m_range);
		packet.r_angle8();			// FIXME mb
		if (m_version > CSE_VERSION_0x0a)
			packet.r_float(m_brightness);
		if (m_version > CSE_VERSION_0x0b)
			packet.r_u16(m_flags);
		if (m_version > CSE_VERSION_0x0c)
			packet.r_u32();
		if (m_version > CSE_VERSION_0x11)
			packet.r_sz(cse_visual::m_startup_animation);
		if (m_version > CSE_VERSION_0x2a) {
			packet.skip_sz();
			packet.r_u32();
		}
		if (m_version > CSE_VERSION_0x2b)
			packet.r_sz(m_fixed_bones);
		if (m_version > CSE_VERSION_0x2c)
			packet.r_float(m_health);
	} else {
		packet.r_u32(m_color);
		packet.r_float(m_brightness);
		packet.r_sz(m_color_animator);
		packet.r_float(m_range);
		packet.r_u16(m_flags);
		packet.r_sz(cse_visual::m_startup_animation);
		packet.r_sz(m_fixed_bones);
		packet.r_float(m_health);
	}
	if (m_version > CSE_VERSION_0x37) {
		packet.r_float(m_virtual_size);
		packet.r_float(m_ambient_radius);
		packet.r_float(m_ambient_power);
		packet.r_sz(m_ambient_texture);
		packet.r_sz(m_light_texture);
		packet.r_sz(m_light_main_bone);
		packet.r_float(m_spot_cone_angle);
		packet.r_sz(m_glow_texture);
		packet.r_float(m_glow_radius);
	}
	if (m_version > CSE_VERSION_0x60)
		packet.r_sz(m_light_ambient_bone);
	if (m_version > CSE_VERSION_0x76) {
		packet.r_float(m_cs_unk1_float);
		packet.r_float(m_cs_unk2_float);
		packet.r_float(m_cs_unk3_float);
	}
}